

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::GetProgramivActiveUniformBlockMaxNameLengthTest::iterate
          (GetProgramivActiveUniformBlockMaxNameLengthTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  char *local_3c0;
  unsigned_long local_350;
  MessageBuilder local_348;
  MessageBuilder local_1b8;
  deUint32 local_34;
  ContextType local_30;
  int local_2c;
  long lStack_28;
  GLint result_value;
  Functions *gl;
  uint local_18;
  GLint expected_result_value;
  GLenum error_code;
  bool result;
  GetProgramivActiveUniformBlockMaxNameLengthTest *this_local;
  
  expected_result_value._3_1_ = 1;
  local_18 = 0;
  gl._4_4_ = 6;
  _error_code = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar2);
  local_2c = 0;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_30.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_34 = (deUint32)glu::ApiType::core(3,1);
  bVar1 = glu::contextSupports(local_30,(ApiType)local_34);
  if (bVar1) {
    bVar1 = initTest(this);
    if (bVar1) {
      (**(code **)(lStack_28 + 0x9d8))(this->m_po_id,0x8a35,&local_2c);
      local_18 = (**(code **)(lStack_28 + 0x800))();
      if (local_18 == 0) {
        if (local_2c != 6) {
          pTVar4 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_348,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_348,
                              (char (*) [46])"glGetIntegerv() returned an invalid value of ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2c);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [35])" instead of the expected value of ");
          local_350 = 6;
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_350);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [97])
                                     " for the GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, where the longest uniform block name is data2."
                             );
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_348);
          expected_result_value._3_1_ = 0;
        }
      }
      else {
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1b8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_1b8,(char (*) [34])"glGetIntegerv() generated error [");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_18);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [46])"] for GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1b8);
        expected_result_value._3_1_ = 0;
      }
    }
    else {
      expected_result_value._3_1_ = 0;
    }
  }
  if ((expected_result_value._3_1_ & 1) == 0) {
    local_3c0 = "Fail";
  }
  else {
    local_3c0 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((expected_result_value._3_1_ & 1) == 0),local_3c0);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetProgramivActiveUniformBlockMaxNameLengthTest::iterate()
{
	bool result = true;

	/* Execute the query */
	glw::GLenum			  error_code			= GL_NO_ERROR;
	const glw::GLint	  expected_result_value = static_cast<glw::GLint>(strlen("data2") + 1 /* terminator */);
	const glw::Functions& gl					= m_context.getRenderContext().getFunctions();
	glw::GLint			  result_value			= 0;

	/* Only execute if we're daeling with GL 3.1 or newer.. */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 1)))
	{
		goto end;
	}

	/* Set up the test program object */
	if (!initTest())
	{
		result = false;

		goto end;
	}

	gl.getProgramiv(m_po_id, GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, &result_value);

	error_code = gl.getError();

	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() generated error [" << error_code
						   << "] for GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH" << tcu::TestLog::EndMessage;

		result = false;
	}
	else if (result_value != expected_result_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() returned an invalid value of " << result_value
						   << " instead of the expected value of " << (strlen("data2") + 1 /* terminator */)
						   << " for the GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, "
							  "where the longest uniform block name is data2."
						   << tcu::TestLog::EndMessage;

		result = false;
	}
end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}